

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

CameraHandle
pbrt::CameraHandle::Create
          (string *name,ParameterDictionary *parameters,MediumHandle *medium,
          CameraTransform *cameraTransform,FilmHandle *film,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  FileLoc *in_RCX;
  SphericalCamera *in_RDX;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char *in_R9;
  ParameterDictionary *in_stack_000000c0;
  CameraHandle *camera;
  FileLoc *in_stack_000003d8;
  MediumHandle *in_stack_000003e0;
  FilmHandle *in_stack_000003e8;
  CameraTransform *in_stack_000003f0;
  ParameterDictionary *in_stack_000003f8;
  Allocator in_stack_00000400;
  FileLoc *in_stack_00000418;
  MediumHandle *in_stack_00000420;
  FilmHandle *in_stack_00000428;
  CameraTransform *in_stack_00000430;
  ParameterDictionary *in_stack_00000438;
  Allocator in_stack_00000440;
  FileLoc *in_stack_00000468;
  MediumHandle *in_stack_00000470;
  FilmHandle *in_stack_00000478;
  CameraTransform *in_stack_00000480;
  ParameterDictionary *in_stack_00000488;
  Allocator in_stack_00000490;
  FileLoc *in_stack_00001450;
  MediumHandle *in_stack_00001458;
  FilmHandle *in_stack_00001460;
  CameraTransform *in_stack_00001468;
  ParameterDictionary *in_stack_00001470;
  Allocator in_stack_00001478;
  PerspectiveCamera *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  
  CameraHandle((CameraHandle *)0x68d71b);
  bVar1 = std::operator==(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  if (bVar1) {
    FilmHandle::FilmHandle
              ((FilmHandle *)in_stack_fffffffffffffef0,(FilmHandle *)in_stack_fffffffffffffee8);
    MediumHandle::MediumHandle
              ((MediumHandle *)in_stack_fffffffffffffef0,(MediumHandle *)in_stack_fffffffffffffee8);
    PerspectiveCamera::Create
              (in_stack_00000438,in_stack_00000430,in_stack_00000428,in_stack_00000420,
               in_stack_00000418,in_stack_00000440);
    TaggedPointer<pbrt::PerspectiveCamera>
              ((CameraHandle *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    operator=((CameraHandle *)in_stack_fffffffffffffef0,(CameraHandle *)in_stack_fffffffffffffee8);
    in_stack_ffffffffffffff20 = in_R8;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    if (bVar1) {
      FilmHandle::FilmHandle
                ((FilmHandle *)in_stack_fffffffffffffef0,(FilmHandle *)in_stack_fffffffffffffee8);
      MediumHandle::MediumHandle
                ((MediumHandle *)in_stack_fffffffffffffef0,(MediumHandle *)in_stack_fffffffffffffee8
                );
      OrthographicCamera::Create
                (in_stack_000003f8,in_stack_000003f0,in_stack_000003e8,in_stack_000003e0,
                 in_stack_000003d8,in_stack_00000400);
      TaggedPointer<pbrt::OrthographicCamera>
                ((CameraHandle *)in_stack_fffffffffffffef0,
                 (OrthographicCamera *)in_stack_fffffffffffffee8);
      operator=((CameraHandle *)in_stack_fffffffffffffef0,(CameraHandle *)in_stack_fffffffffffffee8)
      ;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
      if (bVar1) {
        FilmHandle::FilmHandle
                  ((FilmHandle *)in_stack_fffffffffffffef0,(FilmHandle *)in_stack_fffffffffffffee8);
        MediumHandle::MediumHandle
                  ((MediumHandle *)in_stack_fffffffffffffef0,
                   (MediumHandle *)in_stack_fffffffffffffee8);
        RealisticCamera::Create
                  (in_stack_00001470,in_stack_00001468,in_stack_00001460,in_stack_00001458,
                   in_stack_00001450,in_stack_00001478);
        TaggedPointer<pbrt::RealisticCamera>
                  ((CameraHandle *)in_stack_fffffffffffffef0,
                   (RealisticCamera *)in_stack_fffffffffffffee8);
        operator=((CameraHandle *)in_stack_fffffffffffffef0,
                  (CameraHandle *)in_stack_fffffffffffffee8);
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
        if (!bVar1) {
          ErrorExit<std::__cxx11::string_const&>(in_RCX,in_R9,in_stack_ffffffffffffff20);
        }
        FilmHandle::FilmHandle((FilmHandle *)in_R8,(FilmHandle *)in_RDX);
        MediumHandle::MediumHandle((MediumHandle *)in_R8,(MediumHandle *)in_RDX);
        SphericalCamera::Create
                  (in_stack_00000488,in_stack_00000480,in_stack_00000478,in_stack_00000470,
                   in_stack_00000468,in_stack_00000490);
        TaggedPointer<pbrt::SphericalCamera>((CameraHandle *)in_R8,in_RDX);
        operator=((CameraHandle *)in_R8,(CameraHandle *)in_RDX);
      }
    }
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI.bits);
  if (bVar1) {
    ParameterDictionary::ReportUnused(in_stack_000000c0);
    return (CameraHandle)
           (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
            )in_RDI.bits;
  }
  ErrorExit<std::__cxx11::string_const&>(in_RCX,in_R9,in_stack_ffffffffffffff20);
}

Assistant:

CameraHandle CameraHandle::Create(const std::string &name,
                                  const ParameterDictionary &parameters,
                                  MediumHandle medium,
                                  const CameraTransform &cameraTransform, FilmHandle film,
                                  const FileLoc *loc, Allocator alloc) {
    CameraHandle camera;
    if (name == "perspective")
        camera = PerspectiveCamera::Create(parameters, cameraTransform, film, medium, loc,
                                           alloc);
    else if (name == "orthographic")
        camera = OrthographicCamera::Create(parameters, cameraTransform, film, medium,
                                            loc, alloc);
    else if (name == "realistic")
        camera = RealisticCamera::Create(parameters, cameraTransform, film, medium, loc,
                                         alloc);
    else if (name == "spherical")
        camera = SphericalCamera::Create(parameters, cameraTransform, film, medium, loc,
                                         alloc);
    else
        ErrorExit(loc, "%s: camera type unknown.", name);

    if (!camera)
        ErrorExit(loc, "%s: unable to create camera.", name);

    parameters.ReportUnused();
    return camera;
}